

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  size_type sVar1;
  size_type sVar2;
  string *psVar3;
  string *this;
  size_type sVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_type local_30;
  size_t i;
  string *psStack_20;
  bool replaced;
  string *withThis_local;
  string *replaceThis_local;
  string *str_local;
  
  i._7_1_ = 0;
  psStack_20 = withThis;
  withThis_local = replaceThis;
  replaceThis_local = str;
  local_30 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
             ::find(str,replaceThis,0);
  while (local_30 != 0xffffffffffffffff) {
    i._7_1_ = 1;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,replaceThis_local,0,local_30);
    std::operator+(&local_70,&local_90,psStack_20);
    psVar3 = replaceThis_local;
    sVar1 = local_30;
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       withThis_local);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_c0,psVar3,sVar1 + sVar4,0xffffffffffffffff);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(replaceThis_local,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    sVar1 = local_30;
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       replaceThis_local);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       psStack_20);
    this = replaceThis_local;
    psVar3 = withThis_local;
    sVar2 = local_30;
    if (sVar1 < sVar4 - sVar5) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psStack_20);
      local_30 = clara::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           (this,psVar3,sVar2 + sVar4);
    }
    else {
      local_30 = 0xffffffffffffffff;
    }
  }
  return (bool)(i._7_1_ & 1);
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }